

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleiter.cpp
# Opt level: O0

void __thiscall
icu_63::RuleCharacterIterator::skipIgnored(RuleCharacterIterator *this,int32_t options)

{
  UBool UVar1;
  uint c;
  int32_t count;
  UChar32 a;
  int32_t options_local;
  RuleCharacterIterator *this_local;
  
  if ((options & 4U) != 0) {
    while( true ) {
      c = _current(this);
      UVar1 = PatternProps::isWhiteSpace(c);
      if (UVar1 == '\0') break;
      count = 2;
      if (c < 0x10000) {
        count = 1;
      }
      _advance(this,count);
    }
  }
  return;
}

Assistant:

void RuleCharacterIterator::skipIgnored(int32_t options) {
    if ((options & SKIP_WHITESPACE) != 0) {
        for (;;) {
            UChar32 a = _current();
            if (!PatternProps::isWhiteSpace(a)) break;
            _advance(U16_LENGTH(a));
        }
    }
}